

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void leveldb::_Test_CompactionsGenerateMultipleFiles::_RunIt(void)

{
  undefined1 local_a8 [8];
  _Test_CompactionsGenerateMultipleFiles t;
  
  _Test_CompactionsGenerateMultipleFiles((_Test_CompactionsGenerateMultipleFiles *)local_a8);
  _Run((_Test_CompactionsGenerateMultipleFiles *)local_a8);
  ~_Test_CompactionsGenerateMultipleFiles((_Test_CompactionsGenerateMultipleFiles *)local_a8);
  return;
}

Assistant:

TEST(DBTest, CompactionsGenerateMultipleFiles) {
  Options options = CurrentOptions();
  options.write_buffer_size = 100000000;  // Large write buffer
  Reopen(&options);

  Random rnd(301);

  // Write 8MB (80 values, each 100K)
  ASSERT_EQ(NumTableFilesAtLevel(0), 0);
  std::vector<std::string> values;
  for (int i = 0; i < 80; i++) {
    values.push_back(RandomString(&rnd, 100000));
    ASSERT_OK(Put(Key(i), values[i]));
  }

  // Reopening moves updates to level-0
  Reopen(&options);
  dbfull()->TEST_CompactRange(0, nullptr, nullptr);

  ASSERT_EQ(NumTableFilesAtLevel(0), 0);
  ASSERT_GT(NumTableFilesAtLevel(1), 1);
  for (int i = 0; i < 80; i++) {
    ASSERT_EQ(Get(Key(i)), values[i]);
  }
}